

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
* __thiscall
QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
::operator[](QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
             *this,_List_iterator<Item> *key)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
  *pQVar2;
  _List_node_base *p_Var3;
  _Rb_tree_iterator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>
  _Var4;
  _Base_ptr p_Var5;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>,_bool>
  pVar6;
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
  local_90;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  local_88;
  pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
  local_50;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_90.d.ptr ==
       (QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
           *)local_90.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_90.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_*>
          )(QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
       *)local_90.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>
                        *)local_90.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pQVar2 = (this->d).d.ptr;
  p_Var5 = *(_Base_ptr *)((long)&(pQVar2->m)._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  if (p_Var5 == (_Base_ptr)0x0) {
    p_Var3 = key->_M_node;
  }
  else {
    p_Var1 = &(pQVar2->m)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = key->_M_node;
    _Var4._M_node = &p_Var1->_M_header;
    do {
      if (*(_List_node_base **)(p_Var5 + 1) >= p_Var3) {
        _Var4._M_node = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(_List_node_base **)(p_Var5 + 1) < p_Var3];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)_Var4._M_node != p_Var1) &&
       (*(_List_node_base **)(_Var4._M_node + 1) <= p_Var3)) goto LAB_0010d4b9;
  }
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50.second._M_t._M_impl.super__Rb_tree_header._M_header;
  local_50.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50.second._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50.second._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50.first._M_node = p_Var3;
  local_50.second._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pVar6 = std::
          _Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>,std::_Select1st<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>>
          ::
          _M_insert_unique<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>
                    ((_Rb_tree<std::_List_iterator<Item>,std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>,std::_Select1st<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>,std::less<std::_List_iterator<Item>>,std::allocator<std::pair<std::_List_iterator<Item>const,std::set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>>>>
                      *)&pQVar2->m,&local_50);
  _Var4 = pVar6.first._M_node;
  std::
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  ::_M_erase(&local_50.second._M_t,
             (_Link_type)local_50.second._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  ::_M_erase(&local_88,(_Link_type)local_88._M_impl.super__Rb_tree_header._M_header._M_parent);
LAB_0010d4b9:
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>,_std::less<std::_List_iterator<Item>_>,_std::allocator<std::pair<const_std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
          *)&_Var4._M_node[1]._M_parent;
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }